

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

uint FM_pass(Hypergraph *hypergraph,Partitionment *partitionment,uint max_diff)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  uint uVar3;
  GainedMove local_b0;
  Partitionment best_partitionment;
  GainContainer gain_container;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            (&best_partitionment.partitionment_,&partitionment->partitionment_);
  GainContainer::GainContainer(&gain_container,hypergraph,partitionment);
  uVar2 = 0;
  uVar3 = 0;
  uVar1 = 0;
  while( true ) {
    if ((ulong)(((long)(hypergraph->cells_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(hypergraph->cells_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar2) break;
    local_b0 = GainContainer::getBestMove(&gain_container,max_diff);
    GainContainer::update(&gain_container,hypergraph,partitionment,local_b0.first);
    Partitionment::doMove(partitionment,&local_b0.first);
    uVar3 = uVar3 + local_b0.second;
    if ((int)uVar1 < (int)uVar3) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                (&best_partitionment.partitionment_,&partitionment->partitionment_);
      uVar1 = uVar3;
    }
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&partitionment->partitionment_,
             (vector<bool,_std::allocator<bool>_> *)&best_partitionment);
  GainContainer::~GainContainer(&gain_container);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&best_partitionment);
  return uVar1;
}

Assistant:

unsigned FM_pass(const Hypergraph &hypergraph, Partitionment &partitionment, unsigned max_diff) {
  unsigned best_cost_reduction = 0;
  Partitionment best_partitionment(partitionment);
  GainContainer gain_container(hypergraph, partitionment);
  int cur_cost_reduction = 0;
  for (unsigned i = 0; i < hypergraph.getCells().size(); ++i) {
    auto [move, gain] = gain_container.getBestMove(max_diff);
    gain_container.update(hypergraph, partitionment, move);
    partitionment.doMove(move);
    cur_cost_reduction += gain;
    if (cur_cost_reduction > (int)best_cost_reduction) {
      best_cost_reduction = (unsigned)cur_cost_reduction;
      best_partitionment = partitionment;
    }
  }
  partitionment = std::move(best_partitionment);
  return best_cost_reduction;
}